

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O1

void __thiscall PrimeExtractor::extract(PrimeExtractor *this)

{
  long step;
  long *plVar1;
  _Bit_type *p_Var2;
  ostream *poVar3;
  ulong uVar4;
  
  step = findNextStep(this);
  do {
    iterateVector(this,step);
    step = findNextStep(this);
    if (step < 1) break;
  } while (step <= this->stopSqrt);
  if (1 < this->stop) {
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,2);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  p_Var2 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if (1 < (ulong)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) *
          8) {
    uVar4 = 1;
    do {
      if ((p_Var2[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
        poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      uVar4 = uVar4 + 1;
      p_Var2 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    } while (uVar4 < (ulong)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)p_Var2) * 8);
  }
  return;
}

Assistant:

void PrimeExtractor::extract()
{
    long step = this->findNextStep();
    
    do {
      this->iterateVector(step);
      step = this->findNextStep();
    } while (step > 0 && step <= this->stopSqrt);
    if (this->stop >=2) {
      /**
       * Note: with the procedure described above 2 will never be 
       * calculated but it's prime.
       **/
      std::cout << 2 << std::endl;
    }
    for(long i = 1; i < this->primeCand.size() ; i++) {
      if (this->primeCand[i] == true) {
	  std::cout << i * 2 + 1 << std::endl;
      } 
	
    }
}